

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O3

boolean ecx_configdc(ecx_contextt *context)

{
  byte bVar1;
  ushort parent;
  ec_slavet *peVar2;
  ec_groupt *peVar3;
  int iVar4;
  uint8 uVar5;
  ushort uVar6;
  int32 iVar7;
  int32 iVar8;
  int iVar9;
  uint16 uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16 uVar13;
  uint uVar14;
  undefined8 unaff_RBX;
  ulong uVar15;
  uint16 uVar16;
  int iVar17;
  int iVar18;
  byte bVar19;
  int32 ht;
  int8 plist [4];
  int32 tlist [4];
  int64 hrt;
  int local_80;
  byte local_7c [4];
  ec_slavet *local_78;
  uint local_6c;
  int32 local_68;
  int local_64;
  int local_60;
  int local_5c;
  ecx_contextt *local_58;
  uint local_50;
  int32 local_4c;
  int32 local_48;
  uint local_44;
  ulong local_40;
  long local_38;
  
  uVar11 = 0;
  context->slavelist->hasdc = '\0';
  context->grouplist->hasdc = '\0';
  local_80 = 0;
  ecx_BWR(context->port,0,0x900,4,&local_80,2000);
  if (0 < *context->slavecount) {
    uVar15 = CONCAT62((int6)((ulong)unaff_RBX >> 0x10),1);
    local_58 = context;
    uVar10 = 0;
    do {
      uVar14 = (uint)uVar15;
      uVar16 = (uint16)uVar11;
      peVar2 = context->slavelist;
      uVar13 = (uint16)uVar15;
      uVar12 = uVar15 & 0xffff;
      peVar2[uVar12].consumedports = peVar2[uVar12].activeports;
      if (peVar2[uVar12].hasdc == '\0') {
        peVar2[uVar12].DCrtA = 0;
        peVar2[uVar12].DCrtB = 0;
        peVar2[uVar12].DCrtC = 0;
        peVar2[uVar12].DCrtD = 0;
        uVar6 = peVar2[uVar12].parent;
        if ((((ulong)uVar6 != 0) && (2 < peVar2[uVar6].topology)) || (uVar6 = uVar10, uVar10 != 0))
        {
          if (peVar2[uVar12].topology != '\x01') goto LAB_001098e9;
          ecx_parentport((ecx_contextt *)peVar2,uVar6);
        }
        uVar6 = 0;
      }
      else {
        if (peVar2->hasdc == '\0') {
          peVar2->hasdc = '\x01';
          peVar2->DCnext = uVar13;
          peVar3 = context->grouplist;
          peVar3->hasdc = '\x01';
          peVar3->DCnext = uVar13;
          uVar16 = 0;
        }
        else {
          peVar2[uVar11 & 0xffff].DCnext = uVar13;
        }
        peVar2[uVar12].DCprevious = uVar16;
        uVar6 = peVar2[uVar12].configadr;
        local_40 = uVar12;
        ecx_FPRD(context->port,uVar6,0x900,4,&local_80,2000);
        context->slavelist[uVar12].DCrtA = local_80;
        ecx_FPRD(context->port,uVar6,0x918,8,&local_38,2000);
        local_38 = -local_38;
        ecx_FPWR(context->port,uVar6,0x920,8,&local_38,2000);
        ecx_FPRD(context->port,uVar6,0x904,4,&local_80,2000);
        context->slavelist[uVar12].DCrtB = local_80;
        ecx_FPRD(context->port,uVar6,0x908,4,&local_80,2000);
        context->slavelist[uVar12].DCrtC = local_80;
        ecx_FPRD(context->port,uVar6,0x90c,4,&local_80,2000);
        peVar2 = context->slavelist;
        peVar2[uVar12].DCrtD = local_80;
        bVar1 = peVar2[uVar12].activeports;
        bVar19 = (bVar1 & 1) != 0;
        if ((bool)bVar19) {
          local_7c[0] = 0;
          local_68 = peVar2[uVar12].DCrtA;
        }
        if ((bVar1 & 8) != 0) {
          local_7c[bVar19] = 3;
          (&local_68)[bVar19] = local_80;
          bVar19 = bVar19 + 1;
        }
        if ((bVar1 & 2) != 0) {
          local_7c[bVar19] = 1;
          (&local_68)[bVar19] = peVar2[uVar12].DCrtB;
          bVar19 = bVar19 + 1;
        }
        if ((bVar1 & 4) != 0) {
          local_7c[bVar19] = 2;
          (&local_68)[bVar19] = peVar2[uVar12].DCrtC;
          bVar19 = bVar19 + 1;
        }
        uVar11 = 0;
        if (1 < bVar19) {
          uVar11 = (ulong)(local_64 < local_68);
        }
        if (2 < bVar19) {
          uVar11 = (ulong)(local_64 < local_68);
          if (local_60 < (&local_68)[local_64 < local_68]) {
            uVar11 = 2;
          }
          if ((bVar19 != 3) && (local_5c < (&local_68)[uVar11])) {
            uVar11 = 3;
          }
        }
        bVar1 = local_7c[uVar11];
        peVar2[uVar12].entryport = bVar1;
        peVar2[uVar12].consumedports = peVar2[uVar12].consumedports & ~(byte)(1 << (bVar1 & 0x1f));
        uVar15 = uVar15 & 0xffffffff;
        do {
          uVar11 = uVar15 & 0xffff;
          parent = peVar2[uVar11].parent;
          uVar15 = (ulong)parent;
          local_6c = uVar14;
          if (uVar15 == 0) goto LAB_001098e1;
        } while (peVar2[uVar15].hasdc == '\0');
        local_44 = (uint)uVar6;
        uVar5 = ecx_parentport((ecx_contextt *)peVar2,parent);
        local_78 = context->slavelist;
        local_78[uVar12].parentport = uVar5;
        if (local_78[uVar15].topology == '\x01') {
          uVar5 = local_78[uVar15].entryport;
          local_78[uVar12].parentport = uVar5;
        }
        local_48 = ecx_porttime(context,parent,uVar5);
        uVar5 = ecx_prevport((ecx_contextt *)local_78,parent,uVar5);
        iVar7 = ecx_porttime(context,parent,uVar5);
        iVar18 = 0;
        if (1 < local_78[uVar12].topology) {
          local_50 = (uint)local_78[uVar12].entryport;
          uVar10 = (uint16)local_40;
          local_4c = iVar7;
          uVar5 = ecx_prevport((ecx_contextt *)local_78,uVar10,local_78[uVar12].entryport);
          iVar7 = ecx_porttime(local_58,uVar10,uVar5);
          iVar8 = ecx_porttime(local_58,uVar10,(uint8)local_50);
          iVar18 = iVar7 - iVar8;
          iVar7 = local_4c;
        }
        context = local_58;
        iVar9 = local_48 - iVar7;
        iVar4 = -iVar18;
        if (iVar9 < iVar18) {
          iVar4 = iVar18;
        }
        iVar18 = 0;
        if (1 < (int)((int)uVar11 - (uint)parent)) {
          iVar8 = ecx_porttime(local_58,parent,local_78[uVar15].entryport);
          iVar17 = iVar7 - iVar8;
          iVar18 = -iVar17;
          if (0 < iVar17) {
            iVar18 = iVar17;
          }
        }
        local_80 = (iVar4 + iVar9) / 2 + iVar18 + local_78[uVar15].pdelay;
        local_78[uVar12].pdelay = local_80;
        ecx_FPWR(context->port,(uint16)local_44,0x928,4,&local_80,2000);
LAB_001098e1:
        uVar6 = 0;
        uVar11 = (ulong)local_6c;
        uVar14 = local_6c;
      }
LAB_001098e9:
      uVar15 = (ulong)(uVar14 + 1);
      uVar10 = uVar6;
    } while ((int)(uVar14 + 1 & 0xffff) <= *context->slavecount);
  }
  return context->slavelist->hasdc;
}

Assistant:

boolean ecx_configdc(ecx_contextt *context)
{
   uint16 i, wc, slaveh, parent, child;
   uint16 parenthold = 0;
   uint16 prevDCslave = 0;
   int32 ht, dt1, dt2, dt3;
   int64 hrt;
   uint8 entryport;
   int8 nlist;
   int8 plist[4];
   int32 tlist[4];

   context->slavelist[0].hasdc = FALSE;
   context->grouplist[0].hasdc = FALSE;
   ht = 0;
   ecx_BWR(context->port, 0, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);  /* latch DCrecvTimeA of all slaves */
   for (i = 1; i <= *(context->slavecount); i++)
   {
      context->slavelist[i].consumedports = context->slavelist[i].activeports;
      if (context->slavelist[i].hasdc)
      {
         if (!context->slavelist[0].hasdc)
         {
            context->slavelist[0].hasdc = TRUE;
            context->slavelist[0].DCnext = i;
            context->slavelist[i].DCprevious = 0;
            context->grouplist[0].hasdc = TRUE;
            context->grouplist[0].DCnext = i;
         }
         else
         {
            context->slavelist[prevDCslave].DCnext = i;
            context->slavelist[i].DCprevious = prevDCslave;
         }
         /* this branch has DC slave so remove parenthold */
         parenthold = 0;
         prevDCslave = i;
         slaveh = context->slavelist[i].configadr;
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtA = etohl(ht);
         /* 64bit latched DCrecvTimeA of each specific slave */
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCSOF, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         /* use it as offset in order to set local time around 0 */
         hrt = htoell(-etohll(hrt));
         /* save it in the offset register */
         wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSOFFSET, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME1, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtB = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME2, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtC = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME3, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtD = etohl(ht);

         /* make list of active ports and their time stamps */
         nlist = 0;
         if (context->slavelist[i].activeports & PORTM0) 
         {
            plist[nlist] = 0;
            tlist[nlist] = context->slavelist[i].DCrtA;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM3) 
         {
            plist[nlist] = 3;
            tlist[nlist] = context->slavelist[i].DCrtD;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM1) 
         {
            plist[nlist] = 1;
            tlist[nlist] = context->slavelist[i].DCrtB;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM2) 
         {
            plist[nlist] = 2;
            tlist[nlist] = context->slavelist[i].DCrtC;
            nlist++;
         }
         /* entryport is port with the lowest timestamp */
         entryport = 0;
         if((nlist > 1) && (tlist[1] < tlist[entryport]))
         {
            entryport = 1;
         }         
         if((nlist > 2) && (tlist[2] < tlist[entryport]))
         {
            entryport = 2;
         }
         if((nlist > 3) && (tlist[3] < tlist[entryport]))
         {
            entryport = 3;
         }
         entryport = plist[entryport];
         context->slavelist[i].entryport = entryport;
         /* consume entryport from activeports */
         context->slavelist[i].consumedports &= (uint8)~(1 << entryport);

         /* finding DC parent of current */
         parent = i;
         do
         {
            child = parent;
            parent = context->slavelist[parent].parent;
         }
         while (!((parent == 0) || (context->slavelist[parent].hasdc)));
         /* only calculate propagation delay if slave is not the first */
         if (parent > 0)
         {
            /* find port on parent this slave is connected to */
            context->slavelist[i].parentport = ecx_parentport(context, parent);
            if (context->slavelist[parent].topology == 1)
            {
               context->slavelist[i].parentport = context->slavelist[parent].entryport;
            }

            dt1 = 0;
            dt2 = 0;
            /* delta time of (parentport - 1) - parentport */
            /* note: order of ports is 0 - 3 - 1 -2 */
            /* non active ports are skipped */
            dt3 = ecx_porttime(context, parent, context->slavelist[i].parentport) -
                  ecx_porttime(context, parent, 
                    ecx_prevport(context, parent, context->slavelist[i].parentport));
            /* current slave has children */
            /* those childrens delays need to be substacted */
            if (context->slavelist[i].topology > 1)
            {
               dt1 = ecx_porttime(context, i, 
                        ecx_prevport(context, i, context->slavelist[i].entryport)) -
                     ecx_porttime(context, i, context->slavelist[i].entryport);
            }
            /* we are only interrested in positive diference */
            if (dt1 > dt3) dt1 = -dt1;
            /* current slave is not the first child of parent */
            /* previous childs delays need to be added */
            if ((child - parent) > 1)
            {
               dt2 = ecx_porttime(context, parent, 
                        ecx_prevport(context, parent, context->slavelist[i].parentport)) -
                     ecx_porttime(context, parent, context->slavelist[parent].entryport);
            }
            if (dt2 < 0) dt2 = -dt2;

            /* calculate current slave delay from delta times */
            /* assumption : forward delay equals return delay */
            context->slavelist[i].pdelay = ((dt3 - dt1) / 2) + dt2 +
               context->slavelist[parent].pdelay;
            ht = htoel(context->slavelist[i].pdelay);
            /* write propagation delay*/
            wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSDELAY, sizeof(ht), &ht, EC_TIMEOUTRET);
         }
      }
      else
      {
         context->slavelist[i].DCrtA = 0;
         context->slavelist[i].DCrtB = 0;
         context->slavelist[i].DCrtC = 0;
         context->slavelist[i].DCrtD = 0;
         parent = context->slavelist[i].parent;
         /* if non DC slave found on first position on branch hold root parent */
         if ( (parent > 0) && (context->slavelist[parent].topology > 2))
            parenthold = parent;
         /* if branch has no DC slaves consume port on root parent */
         if ( parenthold && (context->slavelist[i].topology == 1))
         {
            ecx_parentport(context, parenthold);
            parenthold = 0;
         }
      }
   }

   return context->slavelist[0].hasdc;
}